

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write.c
# Opt level: O1

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_connect_t *puVar2;
  int64_t eval_b;
  uv_buf_t buf;
  int64_t eval_b_4;
  undefined1 local_20 [16];
  undefined8 local_10;
  void *local_8;
  
  if (server == (uv_stream_t *)&tcp_server) {
    local_20._8_8_ = SEXT48(status);
    local_20._0_8_ = (void *)0x0;
    if ((uv_loop_t *)local_20._8_8_ != (uv_loop_t *)0x0) goto LAB_001cdc3c;
    iVar1 = uv_tcp_init(tcp_server.loop,&tcp_peer);
    local_20._8_8_ = SEXT48(iVar1);
    local_20._0_8_ = (void *)0x0;
    if ((uv_loop_t *)local_20._8_8_ != (uv_loop_t *)0x0) goto LAB_001cdc4b;
    iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&tcp_peer);
    local_20._8_8_ = SEXT48(iVar1);
    local_20._0_8_ = (void *)0x0;
    if ((uv_loop_t *)local_20._8_8_ != (uv_loop_t *)0x0) goto LAB_001cdc5a;
    iVar1 = uv_read_start((uv_stream_t *)&tcp_peer,alloc_cb,read_cb);
    local_20._8_8_ = SEXT48(iVar1);
    local_20._0_8_ = (void *)0x0;
    if ((uv_loop_t *)local_20._8_8_ == (uv_loop_t *)0x0) {
      local_20._8_8_ = "hello\n";
      local_10._0_4_ = UV_FS;
      local_10._4_4_ = 0;
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_peer,(uv_buf_t *)(local_20 + 8),1,write_cb);
      local_20._0_8_ = SEXT48(iVar1);
      local_8 = (void *)0x0;
      if ((void *)local_20._0_8_ == (void *)0x0) {
        return;
      }
      goto LAB_001cdc78;
    }
  }
  else {
    connection_cb_cold_1();
LAB_001cdc3c:
    connection_cb_cold_2();
LAB_001cdc4b:
    connection_cb_cold_3();
LAB_001cdc5a:
    connection_cb_cold_4();
  }
  connection_cb_cold_5();
LAB_001cdc78:
  puVar2 = (uv_connect_t *)local_20;
  iVar1 = (int)&local_8;
  connection_cb_cold_6();
  if (puVar2 == &connect_req) {
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)&tcp_client,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT_OK(status);

  ASSERT_OK(uv_tcp_init(tcp->loop, &incoming));
  ASSERT_OK(uv_accept(tcp, (uv_stream_t*) &incoming));

  connection_cb_called++;
  ASSERT_OK(uv_read_start((uv_stream_t*) &incoming, alloc_cb, read_cb));
}